

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::BindContext::GetBinding(BindContext *this,BindingAlias *alias,ErrorData *out_error)

{
  reference pvVar1;
  BinderException *this_00;
  Binding *pBVar2;
  allocator local_b1;
  vector<std::reference_wrapper<duckdb::Binding>,_true> matching_bindings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string helper_message;
  
  GetBindings(&matching_bindings,this,alias,out_error);
  if (matching_bindings.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      matching_bindings.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar2 = (Binding *)0x0;
  }
  else {
    if ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)0x8 <
        (vector<std::reference_wrapper<duckdb::Binding>,_true> *)
        ((long)matching_bindings.
               super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)matching_bindings.
              super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      AmbiguityException_abi_cxx11_
                (&helper_message,(BindContext *)alias,(BindingAlias *)&matching_bindings,
                 (vector<std::reference_wrapper<duckdb::Binding>,_true> *)
                 ((long)matching_bindings.
                        super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                        .
                        super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)matching_bindings.
                       super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                       .
                       super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"Ambiguous reference to table \"%s\" %s",&local_b1);
      BindingAlias::ToString_abi_cxx11_(&local_78,alias);
      ::std::__cxx11::string::string((string *)&local_98,(string *)&helper_message);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (this_00,&local_58,&local_78,&local_98);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar1 = vector<std::reference_wrapper<duckdb::Binding>,_true>::get<true>(&matching_bindings,0);
    pBVar2 = pvVar1->_M_data;
  }
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   *)&matching_bindings);
  return (optional_ptr<duckdb::Binding,_true>)pBVar2;
}

Assistant:

optional_ptr<Binding> BindContext::GetBinding(const BindingAlias &alias, ErrorData &out_error) {
	auto matching_bindings = GetBindings(alias, out_error);
	if (matching_bindings.empty()) {
		return nullptr;
	}
	if (matching_bindings.size() > 1) {
		string helper_message = AmbiguityException(alias, matching_bindings);
		throw BinderException("Ambiguous reference to table \"%s\" %s", alias.ToString(), helper_message);
	}
	// found a single matching alias
	return &matching_bindings[0].get();
}